

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O3

bool re2::StringPiece::_equal(StringPiece *x,StringPiece *y)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  
  uVar1 = x->length_;
  if (uVar1 == y->length_) {
    if ((int)uVar1 < 1) {
      return true;
    }
    pcVar2 = x->ptr_;
    pcVar5 = y->ptr_;
    if (pcVar2[uVar1 - 1] == pcVar5[uVar1 - 1]) {
      pcVar3 = pcVar2;
      do {
        pcVar4 = pcVar3 + 1;
        bVar6 = *pcVar3 == *pcVar5;
        if (!bVar6) {
          return bVar6;
        }
        pcVar5 = pcVar5 + 1;
        pcVar3 = pcVar4;
      } while (pcVar4 < pcVar2 + uVar1);
      return bVar6;
    }
  }
  return false;
}

Assistant:

int size() const { return length_; }